

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O3

void UpdateAllSourceProps(ALCcontext *context)

{
  atomic_flag *paVar1;
  __atomic_flag_data_type _Var2;
  __int_type _Var3;
  __pointer_type pFVar4;
  __int_type_conflict2 _Var5;
  Voice *voice;
  pointer pSVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ALsource *source;
  long lVar11;
  
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&context->mSourceLock);
  if (iVar8 == 0) {
    pFVar4 = (context->mVoices)._M_b._M_p;
    _Var5 = (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i;
    if (_Var5 != 0) {
      lVar11 = 0;
      do {
        voice = *(Voice **)((long)&pFVar4->field_1 + lVar11);
        _Var3 = (voice->mSourceID).super___atomic_base<unsigned_int>._M_i;
        if (_Var3 != 0) {
          pSVar6 = (context->mSourceList).
                   super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar9 = _Var3 - 1;
          if (((ulong)(uVar9 >> 6) <
               (ulong)((long)(context->mSourceList).
                             super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 4)) &&
             (uVar10 = (ulong)((uVar9 >> 6) << 4),
             lVar7 = *(long *)((long)&pSVar6->Sources + uVar10),
             lVar7 != 0 &&
             (*(ulong *)((long)&pSVar6->FreeMask + uVar10) >> ((ulong)uVar9 & 0x3f) & 1) == 0)) {
            source = (ALsource *)(lVar7 + (ulong)(uVar9 & 0x3f) * 0x198);
            LOCK();
            paVar1 = &source->PropsClean;
            _Var2 = (paVar1->super___atomic_flag_base)._M_i;
            (paVar1->super___atomic_flag_base)._M_i = true;
            UNLOCK();
            if (_Var2 == false) {
              anon_unknown.dwarf_54919::UpdateSourceProps(source,voice,context);
            }
          }
        }
        lVar11 = lVar11 + 8;
      } while (_Var5 << 3 != lVar11);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&context->mSourceLock);
    return;
  }
  std::__throw_system_error(iVar8);
}

Assistant:

void UpdateAllSourceProps(ALCcontext *context)
{
    std::lock_guard<std::mutex> _{context->mSourceLock};
    auto voicelist = context->getVoicesSpan();
    std::for_each(voicelist.begin(), voicelist.end(),
        [context](Voice *voice) -> void
        {
            ALuint sid{voice->mSourceID.load(std::memory_order_acquire)};
            ALsource *source = sid ? LookupSource(context, sid) : nullptr;
            if(source && !source->PropsClean.test_and_set(std::memory_order_acq_rel))
                UpdateSourceProps(source, voice, context);
        }
    );
}